

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TestRegistry::registerTest
          (TestRegistry *this,unique_ptr<Catch::TestCaseInfo> *testInfo,
          unique_ptr<Catch::ITestInvoker> *testInvoker)

{
  TestCaseInfo *local_38;
  ITestInvoker *local_30;
  TestCaseInfo *local_28;
  unique_ptr<Catch::ITestInvoker> *local_20;
  unique_ptr<Catch::ITestInvoker> *testInvoker_local;
  unique_ptr<Catch::TestCaseInfo> *testInfo_local;
  TestRegistry *this_local;
  
  local_20 = testInvoker;
  testInvoker_local = (unique_ptr<Catch::ITestInvoker> *)testInfo;
  testInfo_local = (unique_ptr<Catch::TestCaseInfo> *)this;
  local_28 = Detail::unique_ptr<Catch::TestCaseInfo>::get(testInfo);
  local_30 = Detail::unique_ptr<Catch::ITestInvoker>::get(testInvoker);
  std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>::
  emplace_back<Catch::TestCaseInfo*,Catch::ITestInvoker*>
            ((vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>> *)&this->m_handles
             ,&local_28,&local_30);
  local_38 = Detail::unique_ptr<Catch::TestCaseInfo>::get(testInfo);
  std::vector<Catch::TestCaseInfo_*,_std::allocator<Catch::TestCaseInfo_*>_>::push_back
            (&this->m_viewed_test_infos,&local_38);
  std::
  vector<Catch::Detail::unique_ptr<Catch::TestCaseInfo>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseInfo>_>_>
  ::push_back(&this->m_owned_test_infos,testInfo);
  std::
  vector<Catch::Detail::unique_ptr<Catch::ITestInvoker>,_std::allocator<Catch::Detail::unique_ptr<Catch::ITestInvoker>_>_>
  ::push_back(&this->m_invokers,testInvoker);
  return;
}

Assistant:

void TestRegistry::registerTest(Detail::unique_ptr<TestCaseInfo> testInfo, Detail::unique_ptr<ITestInvoker> testInvoker) {
        m_handles.emplace_back(testInfo.get(), testInvoker.get());
        m_viewed_test_infos.push_back(testInfo.get());
        m_owned_test_infos.push_back(CATCH_MOVE(testInfo));
        m_invokers.push_back(CATCH_MOVE(testInvoker));
    }